

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[26],unsigned_int,char[15],unsigned_int,char[14]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [26],uint *RestArgs,char (*RestArgs_1) [15],uint *RestArgs_2,
               char (*RestArgs_3) [14])

{
  char (*RestArgs_local_3) [14];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [15];
  uint *RestArgs_local;
  char (*FirstArg_local) [26];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[26]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[15],unsigned_int,char[14]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}